

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampUnusedChannelCase::
TextureBorderClampUnusedChannelCase
          (TextureBorderClampUnusedChannelCase *this,Context *context,char *name,char *description,
          deUint32 texFormat,DepthStencilMode depthStencilMode)

{
  DepthStencilMode depthStencilMode_local;
  deUint32 texFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureBorderClampUnusedChannelCase *this_local;
  
  TextureBorderClampTest::TextureBorderClampTest
            (&this->super_TextureBorderClampTest,context,name,description,texFormat,depthStencilMode
             ,STATE_TEXTURE_PARAM,8,8,SAMPLE_FILTER,0);
  (this->super_TextureBorderClampTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampUnusedChannelCase_032c6a28;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::vector(&this->m_iterations);
  return;
}

Assistant:

TextureBorderClampUnusedChannelCase::TextureBorderClampUnusedChannelCase (Context&							context,
																		  const char*						name,
																		  const char*						description,
																		  deUint32							texFormat,
																		  tcu::Sampler::DepthStencilMode	depthStencilMode)
	: TextureBorderClampTest(context,
							 name,
							 description,
							 texFormat,
							 depthStencilMode,
							 TextureBorderClampTest::STATE_TEXTURE_PARAM,
							 8,
							 8,
							 SAMPLE_FILTER)
{
}